

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec,uchar *tweak32)

{
  bool bVar1;
  int overflow;
  secp256k1_scalar term;
  int local_4c;
  secp256k1_scalar local_48;
  
  local_4c = 0;
  secp256k1_scalar_set_b32(&local_48,tweak32,&local_4c);
  bVar1 = local_4c == 0;
  secp256k1_scalar_add(sec,sec,&local_48);
  return (int)(((sec->d[3] != 0 || sec->d[1] != 0) || (sec->d[2] != 0 || sec->d[0] != 0)) && bVar1);
}

Assistant:

static int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    int ret = 0;

    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    ret = (!overflow) & secp256k1_eckey_privkey_tweak_add(sec, &term);
    secp256k1_scalar_clear(&term);
    return ret;
}